

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  TargetType TVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  cmGeneratorTarget *local_1a0;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string langPrefix;
  char *prefixVar;
  string local_b8;
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  string local_90;
  cmGeneratorTarget *local_70;
  char *targetPrefix;
  byte local_52;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool isImportedLibraryArtifact;
  string *language_local;
  cmGeneratorTarget *pcStack_18;
  ArtifactType artifact_local;
  cmGeneratorTarget *this_local;
  
  psStack_28 = language;
  language_local._4_4_ = artifact;
  pcStack_18 = this;
  TVar3 = GetType(this);
  if ((((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
      (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) ||
     (TVar3 = GetType(this), TVar3 == EXECUTABLE)) {
    local_29 = language_local._4_4_ == ImportLibraryArtifact;
    local_52 = 0;
    targetPrefix._3_1_ = 0;
    bVar6 = false;
    if ((bool)local_29) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_52 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_51);
      targetPrefix._3_1_ = 1;
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_50);
      bVar6 = pcVar4 == (char *)0x0;
    }
    if ((targetPrefix._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if ((local_52 & 1) != 0) {
      std::allocator<char>::~allocator(&local_51);
    }
    if (bVar6) {
      this_local = (cmGeneratorTarget *)0x0;
    }
    else {
      TVar3 = GetType(this);
      if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
         (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
        language_local._4_4_ = RuntimeBinaryArtifact;
      }
      local_92 = 0;
      local_93 = 0;
      prefixVar._6_1_ = 0;
      prefixVar._5_1_ = 0;
      if ((local_29 & 1) == 0) {
        std::allocator<char>::allocator();
        prefixVar._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"PREFIX",(allocator<char> *)((long)&prefixVar + 7));
        prefixVar._5_1_ = 1;
        local_1a0 = (cmGeneratorTarget *)GetProperty(this,&local_b8);
      }
      else {
        std::allocator<char>::allocator();
        local_92 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"IMPORT_PREFIX",&local_91);
        local_93 = 1;
        local_1a0 = (cmGeneratorTarget *)GetProperty(this,&local_90);
      }
      if ((prefixVar._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      if ((prefixVar._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&prefixVar + 7));
      }
      if ((local_93 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_92 & 1) != 0) {
        std::allocator<char>::~allocator(&local_91);
      }
      local_70 = local_1a0;
      if (local_1a0 == (cmGeneratorTarget *)0x0) {
        langPrefix.field_2._8_8_ =
             cmTarget::GetPrefixVariableInternal(this->Target,language_local._4_4_);
        uVar5 = std::__cxx11::string::empty();
        uVar2 = langPrefix.field_2._8_8_;
        if ((((uVar5 & 1) == 0) && (langPrefix.field_2._8_8_ != 0)) &&
           (*(char *)langPrefix.field_2._8_8_ != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"_",&local_129);
          std::operator+(&local_108,(char *)uVar2,&local_128);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,&local_108,psStack_28);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator(&local_129);
          local_70 = (cmGeneratorTarget *)
                     cmMakefile::GetDefinition(this->Makefile,(string *)local_e8);
          std::__cxx11::string::~string((string *)local_e8);
        }
        uVar2 = langPrefix.field_2._8_8_;
        if ((local_70 == (cmGeneratorTarget *)0x0) && (langPrefix.field_2._8_8_ != 0)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,(char *)uVar2,&local_151);
          local_70 = (cmGeneratorTarget *)cmMakefile::GetDefinition(pcVar1,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator(&local_151);
        }
      }
      this_local = local_70;
    }
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetFilePrefixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + language;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}